

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonNode * jsonMergePatch(JsonParse *pParse,u32 iTarget,JsonNode *pPatch)

{
  u8 *puVar1;
  uint n;
  char *__s2;
  uint uVar2;
  int iVar3;
  uint uVar4;
  JsonNode *pJVar5;
  JsonNode *pJVar6;
  JsonNode *pJVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  pJVar7 = pPatch;
  if (pPatch->eType == '\a') {
    if (pParse->aNode[iTarget].eType == '\a') {
      pJVar7 = pParse->aNode + iTarget;
      if (1 < pPatch->n) {
        uVar9 = 1;
        uVar2 = iTarget;
        do {
          iVar8 = (int)uVar9;
          n = pPatch[uVar9].n;
          __s2 = pPatch[uVar9].u.zJContent;
          uVar4 = pJVar7->n;
          uVar9 = 1;
          uVar10 = 1;
          if (1 < uVar4) {
            do {
              uVar10 = (uint)uVar9;
              if ((pJVar7[uVar9].n == n) &&
                 (iVar3 = strncmp(pJVar7[uVar9].u.zJContent,__s2,(ulong)n), iVar3 == 0)) {
                uVar4 = uVar10 + 1;
                if ((pJVar7[uVar4].jnFlags & 0x14) == 0) {
                  if (pPatch[iVar8 + 1U].eType == '\0') {
                    pJVar7[uVar4].jnFlags = pJVar7[uVar4].jnFlags | 4;
                  }
                  else {
                    pJVar5 = jsonMergePatch(pParse,iTarget + 1 + uVar10,pPatch + (iVar8 + 1U));
                    if (pJVar5 != (JsonNode *)0x0) {
                      pJVar7 = pParse->aNode + iTarget;
                      pJVar6 = pJVar7 + uVar4;
                      if (pJVar5 != pJVar6) {
                        (pJVar6->u).pPatch = pJVar5;
                        pJVar6->jnFlags = pJVar6->jnFlags | 0x10;
                      }
                    }
                    if (pJVar5 == (JsonNode *)0x0) {
                      bVar11 = false;
                      goto LAB_001c0052;
                    }
                  }
                }
                break;
              }
              iVar3 = 2;
              if (5 < pJVar7[uVar10 + 1].eType) {
                iVar3 = pJVar7[uVar10 + 1].n + 2;
              }
              uVar10 = uVar10 + iVar3;
              uVar9 = (ulong)uVar10;
            } while (uVar10 < uVar4);
          }
          bVar11 = true;
          if ((pJVar7->n <= uVar10) && (pPatch[iVar8 + 1U].eType != '\0')) {
            uVar4 = jsonParseAddNode(pParse,7,2,(char *)0x0);
            jsonParseAddNode(pParse,5,n,__s2);
            iVar3 = jsonParseAddNode(pParse,1,0,(char *)0x0);
            bVar11 = pParse->oom == '\0';
            if (bVar11) {
              jsonRemoveAllNulls(pPatch);
              pJVar7 = pParse->aNode;
              pJVar7[uVar2].jnFlags = pJVar7[uVar2].jnFlags | 0x20;
              pJVar7[uVar2].u.iAppend = uVar4 - uVar2;
              pJVar5 = pParse->aNode;
              puVar1 = &pJVar5[iVar3].jnFlags;
              *puVar1 = *puVar1 | 0x10;
              pJVar7 = pJVar7 + iTarget;
              pJVar5[iVar3].u.zJContent = (char *)(pPatch + (iVar8 + 1U));
              uVar2 = uVar4;
            }
          }
LAB_001c0052:
          if (!bVar11) {
            return (JsonNode *)0x0;
          }
          iVar3 = 2;
          if (5 < pPatch[iVar8 + 1U].eType) {
            iVar3 = pPatch[iVar8 + 1U].n + 2;
          }
          uVar9 = (ulong)(uint)(iVar8 + iVar3);
        } while ((uint)(iVar8 + iVar3) < pPatch->n);
      }
    }
    else {
      jsonRemoveAllNulls(pPatch);
    }
  }
  return pJVar7;
}

Assistant:

static JsonNode *jsonMergePatch(
  JsonParse *pParse,   /* The JSON parser that contains the TARGET */
  u32 iTarget,         /* Node of the TARGET in pParse */
  JsonNode *pPatch     /* The PATCH */
){
  u32 i, j;
  u32 iRoot;
  JsonNode *pTarget;
  if( pPatch->eType!=JSON_OBJECT ){
    return pPatch;
  }
  assert( iTarget<pParse->nNode );
  pTarget = &pParse->aNode[iTarget];
  assert( (pPatch->jnFlags & JNODE_APPEND)==0 );
  if( pTarget->eType!=JSON_OBJECT ){
    jsonRemoveAllNulls(pPatch);
    return pPatch;
  }
  iRoot = iTarget;
  for(i=1; i<pPatch->n; i += jsonNodeSize(&pPatch[i+1])+1){
    u32 nKey;
    const char *zKey;
    assert( pPatch[i].eType==JSON_STRING );
    assert( pPatch[i].jnFlags & JNODE_LABEL );
    assert( pPatch[i].eU==1 );
    nKey = pPatch[i].n;
    zKey = pPatch[i].u.zJContent;
    assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
    for(j=1; j<pTarget->n; j += jsonNodeSize(&pTarget[j+1])+1 ){
      assert( pTarget[j].eType==JSON_STRING );
      assert( pTarget[j].jnFlags & JNODE_LABEL );
      assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
      if( pTarget[j].n==nKey && strncmp(pTarget[j].u.zJContent,zKey,nKey)==0 ){
        if( pTarget[j+1].jnFlags & (JNODE_REMOVE|JNODE_PATCH) ) break;
        if( pPatch[i+1].eType==JSON_NULL ){
          pTarget[j+1].jnFlags |= JNODE_REMOVE;
        }else{
          JsonNode *pNew = jsonMergePatch(pParse, iTarget+j+1, &pPatch[i+1]);
          if( pNew==0 ) return 0;
          pTarget = &pParse->aNode[iTarget];
          if( pNew!=&pTarget[j+1] ){
            assert( pTarget[j+1].eU==0
                 || pTarget[j+1].eU==1
                 || pTarget[j+1].eU==2 );
            testcase( pTarget[j+1].eU==1 );
            testcase( pTarget[j+1].eU==2 );
            VVA( pTarget[j+1].eU = 5 );
            pTarget[j+1].u.pPatch = pNew;
            pTarget[j+1].jnFlags |= JNODE_PATCH;
          }
        }
        break;
      }
    }
    if( j>=pTarget->n && pPatch[i+1].eType!=JSON_NULL ){
      int iStart, iPatch;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      iPatch = jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
      if( pParse->oom ) return 0;
      jsonRemoveAllNulls(pPatch);
      pTarget = &pParse->aNode[iTarget];
      assert( pParse->aNode[iRoot].eU==0 || pParse->aNode[iRoot].eU==2 );
      testcase( pParse->aNode[iRoot].eU==2 );
      pParse->aNode[iRoot].jnFlags |= JNODE_APPEND;
      VVA( pParse->aNode[iRoot].eU = 2 );
      pParse->aNode[iRoot].u.iAppend = iStart - iRoot;
      iRoot = iStart;
      assert( pParse->aNode[iPatch].eU==0 );
      VVA( pParse->aNode[iPatch].eU = 5 );
      pParse->aNode[iPatch].jnFlags |= JNODE_PATCH;
      pParse->aNode[iPatch].u.pPatch = &pPatch[i+1];
    }
  }
  return pTarget;
}